

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O2

void __thiscall soul::heart::Parser::parseAnnotation(Parser *this,Annotation *annotation)

{
  bool bVar1;
  string name;
  Value local_b0;
  Value value;
  
  bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matchIf<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)0x275da2);
  if (bVar1) {
    bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ::matchIf<soul::TokenType>
                      (&this->
                        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                       ,(TokenType)0x275af2);
    if (!bVar1) {
      do {
        bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                ::matchIf<soul::TokenType>
                          (&this->
                            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                           ,(TokenType)0x275d47);
        if (bVar1) {
          std::__cxx11::string::string
                    ((string *)&name,
                     (string *)
                     &(this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                      ).currentStringValue);
        }
        else {
          readGeneralIdentifier_abi_cxx11_(&name,this);
        }
        bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                ::matchIf<soul::TokenType>
                          (&this->
                            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                           ,(TokenType)0x275274);
        if (bVar1) {
          parseAnnotationValue(&value,this);
        }
        else {
          soul::Value::Value(&value,true);
        }
        soul::Value::Value(&local_b0,&value);
        Annotation::set(annotation,&name,&local_b0,&((this->program).pimpl)->stringDictionary);
        soul::Value::~Value(&local_b0);
        soul::Value::~Value(&value);
        std::__cxx11::string::~string((string *)&name);
        bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                ::matchIf<soul::TokenType>
                          (&this->
                            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                           ,(TokenType)0x275d9e);
      } while (bVar1);
      Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
      expect<soul::TokenType>
                (&this->
                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                 ,(TokenType)0x275af2);
    }
  }
  return;
}

Assistant:

void parseAnnotation (Annotation& annotation)
    {
        if (matchIf (HEARTOperator::openDoubleBracket))
        {
            if (matchIf (HEARTOperator::closeDoubleBracket))
                return;

            do
            {
                auto name  = matchIf (Token::literalString) ? currentStringValue : readGeneralIdentifier();
                auto value = matchIf (HEARTOperator::colon) ? parseAnnotationValue() : Value (true);

                annotation.set (name, value, program.getStringDictionary());
            }
            while (matchIf (HEARTOperator::comma));

            expect (HEARTOperator::closeDoubleBracket);
        }
    }